

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::vector<pbrt::RGB,pstd::pmr::polymorphic_allocator<pbrt::RGB>>::vector<pbrt::RGB_const*>
          (vector<pbrt::RGB,pstd::pmr::polymorphic_allocator<pbrt::RGB>> *this,RGB *first,RGB *last,
          polymorphic_allocator<pbrt::RGB> *alloc)

{
  RGB *pRVar1;
  long lVar2;
  long lVar3;
  
  *(memory_resource **)this = alloc->memoryResource;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_>::reserve
            ((vector<pbrt::RGB,_pstd::pmr::polymorphic_allocator<pbrt::RGB>_> *)this,
             ((long)last - (long)first >> 2) * -0x5555555555555555);
  if (last != first) {
    lVar3 = 0;
    do {
      lVar2 = *(long *)(this + 8);
      pRVar1 = (RGB *)((long)&first[1].r + lVar3);
      *(Float *)(lVar2 + 8 + lVar3) = pRVar1[-1].b;
      *(undefined8 *)(lVar2 + lVar3) = *(undefined8 *)(pRVar1 + -1);
      lVar3 = lVar3 + 0xc;
    } while (pRVar1 != last);
  }
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }